

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

uchar * stbtt_GetGlyphBitmapSubpixel
                  (stbtt_fontinfo *info,float scale_x,float scale_y,float shift_x,float shift_y,
                  int glyph,int *width,int *height,int *xoff,int *yoff)

{
  bool bVar1;
  int num_verts;
  int iVar2;
  float scale_y_00;
  void *in_stack_ffffffffffffff58;
  int local_98;
  int local_94;
  int ix0;
  int iy0;
  int ix1;
  int iy1;
  stbtt__bitmap gbm;
  stbtt_vertex *local_48;
  stbtt_vertex *vertices;
  float local_38;
  float local_34;
  
  gbm.pixels = (uchar *)width;
  vertices._0_4_ = shift_y;
  vertices._4_4_ = shift_x;
  local_38 = scale_y;
  local_34 = scale_x;
  num_verts = stbtt_GetGlyphShape(info,glyph,&local_48);
  bVar1 = local_34 == 0.0;
  if ((bVar1) && (!NAN(local_34))) {
    local_34 = local_38;
  }
  scale_y_00 = local_38;
  if ((local_38 == 0.0) && (!NAN(local_38))) {
    scale_y_00 = local_34;
  }
  if (bVar1 && local_38 == 0.0) {
    free(local_48);
    gbm._8_8_ = (uchar *)0x0;
  }
  else {
    local_38 = scale_y_00;
    stbtt_GetGlyphBitmapBoxSubpixel
              (info,glyph,local_34,scale_y_00,vertices._4_4_,vertices._0_4_,&local_98,&local_94,&ix0
               ,&iy0);
    iVar2 = ix0 - local_98;
    iy1 = iy0 - local_94;
    gbm.stride = 0;
    gbm._12_4_ = 0;
    if (gbm.pixels != (uchar *)0x0) {
      *(int *)gbm.pixels = iVar2;
    }
    if (height != (int *)0x0) {
      *height = iy1;
    }
    if (xoff != (int *)0x0) {
      *xoff = local_98;
    }
    if (yoff != (int *)0x0) {
      *yoff = local_94;
    }
    ix1 = iVar2;
    if ((iy0 != local_94 && ix0 != local_98) &&
       (gbm._8_8_ = malloc((long)(iy1 * iVar2)), (void *)gbm._8_8_ != (void *)0x0)) {
      gbm.w = iVar2;
      stbtt_Rasterize((stbtt__bitmap *)&ix1,0.35,local_48,num_verts,local_34,local_38,vertices._4_4_
                      ,vertices._0_4_,local_98,local_94,1,in_stack_ffffffffffffff58);
    }
    free(local_48);
  }
  return (uchar *)gbm._8_8_;
}

Assistant:

STBTT_DEF unsigned char *stbtt_GetGlyphBitmapSubpixel(const stbtt_fontinfo *info, float scale_x, float scale_y, float shift_x, float shift_y, int glyph, int *width, int *height, int *xoff, int *yoff)
{
   int ix0,iy0,ix1,iy1;
   stbtt__bitmap gbm;
   stbtt_vertex *vertices;   
   int num_verts = stbtt_GetGlyphShape(info, glyph, &vertices);

   if (scale_x == 0) scale_x = scale_y;
   if (scale_y == 0) {
      if (scale_x == 0) {
         STBTT_free(vertices, info->userdata);
         return NULL;
      }
      scale_y = scale_x;
   }

   stbtt_GetGlyphBitmapBoxSubpixel(info, glyph, scale_x, scale_y, shift_x, shift_y, &ix0,&iy0,&ix1,&iy1);

   // now we get the size
   gbm.w = (ix1 - ix0);
   gbm.h = (iy1 - iy0);
   gbm.pixels = NULL; // in case we error

   if (width ) *width  = gbm.w;
   if (height) *height = gbm.h;
   if (xoff  ) *xoff   = ix0;
   if (yoff  ) *yoff   = iy0;
   
   if (gbm.w && gbm.h) {
      gbm.pixels = (unsigned char *) STBTT_malloc(gbm.w * gbm.h, info->userdata);
      if (gbm.pixels) {
         gbm.stride = gbm.w;

         stbtt_Rasterize(&gbm, 0.35f, vertices, num_verts, scale_x, scale_y, shift_x, shift_y, ix0, iy0, 1, info->userdata);
      }
   }
   STBTT_free(vertices, info->userdata);
   return gbm.pixels;
}